

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O0

UniquePtr<EVP_PKEY> LoadPrivateKey(string *file)

{
  bool bVar1;
  int iVar2;
  BIO_METHOD *type;
  BIO *pBVar3;
  pointer bio_00;
  char *filename;
  EVP_PKEY *__p;
  unique_ptr<bio_st,_bssl::internal::Deleter> local_20;
  UniquePtr<BIO> bio;
  string *file_local;
  
  type = BIO_s_file();
  pBVar3 = BIO_new(type);
  std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<bio_st,bssl::internal::Deleter> *)&local_20,(pointer)pBVar3);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_20);
  if (bVar1) {
    bio_00 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_20);
    filename = (char *)std::__cxx11::string::c_str();
    iVar2 = BIO_read_filename(bio_00,filename);
    if (iVar2 != 0) {
      pBVar3 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&local_20);
      __p = PEM_read_bio_PrivateKey(pBVar3,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)file,(pointer)__p);
      goto LAB_00131bc4;
    }
  }
  std::unique_ptr<evp_pkey_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<evp_pkey_st,bssl::internal::Deleter> *)file,(nullptr_t)0x0);
LAB_00131bc4:
  std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&local_20);
  return (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<evp_pkey_st,_bssl::internal::Deleter,_true,_true>)file;
}

Assistant:

bssl::UniquePtr<EVP_PKEY> LoadPrivateKey(const std::string &file) {
  bssl::UniquePtr<BIO> bio(BIO_new(BIO_s_file()));
  if (!bio || !BIO_read_filename(bio.get(), file.c_str())) {
    return nullptr;
  }
  return bssl::UniquePtr<EVP_PKEY>(
      PEM_read_bio_PrivateKey(bio.get(), NULL, NULL, NULL));
}